

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O0

void boost::detail::(anonymous_namespace)::tls_destructor(void *data)

{
  bool bVar1;
  bool bVar2;
  type ptVar3;
  pointer ppVar4;
  iterator current;
  thread_exit_callback_node *current_node;
  thread_data_ptr thread_info;
  map<const_void_*,_boost::detail::tss_data_node,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>_>
  *in_stack_ffffffffffffff78;
  iterator in_stack_ffffffffffffff80;
  iterator in_stack_ffffffffffffff88;
  shared_ptr<boost::detail::thread_data_base> *in_stack_ffffffffffffff90;
  enable_shared_from_this<boost::detail::thread_data_base> *in_stack_ffffffffffffffa8;
  _Base_ptr p_Var5;
  _Base_ptr local_38 [3];
  _Base_ptr local_20;
  shared_ptr local_18 [24];
  
  enable_shared_from_this<boost::detail::thread_data_base>::shared_from_this
            (in_stack_ffffffffffffffa8);
  bVar1 = boost::shared_ptr::operator_cast_to_bool(local_18);
  if (bVar1) {
    while( true ) {
      shared_ptr<boost::detail::thread_data_base>::operator->
                ((shared_ptr<boost::detail::thread_data_base> *)in_stack_ffffffffffffff80._M_node);
      bVar2 = std::
              map<const_void_*,_boost::detail::tss_data_node,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>_>
              ::empty((map<const_void_*,_boost::detail::tss_data_node,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>_>
                       *)0x2a4bf3);
      bVar1 = true;
      if (bVar2) {
        ptVar3 = shared_ptr<boost::detail::thread_data_base>::operator->
                           ((shared_ptr<boost::detail::thread_data_base> *)
                            in_stack_ffffffffffffff80._M_node);
        bVar1 = ptVar3->thread_exit_callbacks != (thread_exit_callback_node *)0x0;
      }
      if (!bVar1) break;
      while (ptVar3 = shared_ptr<boost::detail::thread_data_base>::operator->
                                ((shared_ptr<boost::detail::thread_data_base> *)
                                 in_stack_ffffffffffffff80._M_node),
            ptVar3->thread_exit_callbacks != (thread_exit_callback_node *)0x0) {
        ptVar3 = shared_ptr<boost::detail::thread_data_base>::operator->
                           ((shared_ptr<boost::detail::thread_data_base> *)
                            in_stack_ffffffffffffff80._M_node);
        local_20 = (_Base_ptr)ptVar3->thread_exit_callbacks;
        p_Var5 = local_20->_M_parent;
        ptVar3 = shared_ptr<boost::detail::thread_data_base>::operator->
                           ((shared_ptr<boost::detail::thread_data_base> *)
                            in_stack_ffffffffffffff80._M_node);
        ptVar3->thread_exit_callbacks = (thread_exit_callback_node *)p_Var5;
        if (*(long *)local_20 != 0) {
          (**(code **)(**(long **)local_20 + 0x10))();
          if (*(long **)local_20 != (long *)0x0) {
            (**(code **)(**(long **)local_20 + 8))();
          }
        }
        if (local_20 != (_Base_ptr)0x0) {
          operator_delete(local_20,0x10);
        }
      }
      while( true ) {
        shared_ptr<boost::detail::thread_data_base>::operator->
                  ((shared_ptr<boost::detail::thread_data_base> *)in_stack_ffffffffffffff80._M_node)
        ;
        bVar1 = std::
                map<const_void_*,_boost::detail::tss_data_node,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>_>
                ::empty((map<const_void_*,_boost::detail::tss_data_node,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>_>
                         *)0x2a4d16);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        shared_ptr<boost::detail::thread_data_base>::operator->
                  ((shared_ptr<boost::detail::thread_data_base> *)in_stack_ffffffffffffff80._M_node)
        ;
        local_38[0] = (_Base_ptr)
                      std::
                      map<const_void_*,_boost::detail::tss_data_node,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>_>
                      ::begin(in_stack_ffffffffffffff78);
        ppVar4 = std::_Rb_tree_iterator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>
                               *)0x2a4d49);
        bVar1 = boost::shared_ptr::operator_cast_to_bool((shared_ptr *)&ppVar4->second);
        if ((bVar1) &&
           (ppVar4 = std::
                     _Rb_tree_iterator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>
                     ::operator->((_Rb_tree_iterator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>
                                   *)0x2a4d65), (ppVar4->second).value != (void *)0x0)) {
          in_stack_ffffffffffffff88._M_node = (_Base_ptr)local_38;
          std::_Rb_tree_iterator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>::
          operator->((_Rb_tree_iterator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>
                      *)0x2a4d7b);
          in_stack_ffffffffffffff90 =
               (shared_ptr<boost::detail::thread_data_base> *)
               shared_ptr<boost::detail::tss_cleanup_function>::operator*
                         ((shared_ptr<boost::detail::tss_cleanup_function> *)
                          in_stack_ffffffffffffff80._M_node);
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>::
                   operator->((_Rb_tree_iterator<std::pair<const_void_*const,_boost::detail::tss_data_node>_>
                               *)0x2a4d96);
          (*(code *)(in_stack_ffffffffffffff90->px->
                    super_enable_shared_from_this<boost::detail::thread_data_base>).weak_this_.pn.
                    pi_)(in_stack_ffffffffffffff90,(ppVar4->second).value);
        }
        shared_ptr<boost::detail::thread_data_base>::operator->
                  ((shared_ptr<boost::detail::thread_data_base> *)in_stack_ffffffffffffff80._M_node)
        ;
        in_stack_ffffffffffffff80 =
             std::
             map<void_const*,boost::detail::tss_data_node,std::less<void_const*>,std::allocator<std::pair<void_const*const,boost::detail::tss_data_node>>>
             ::erase_abi_cxx11_(in_stack_ffffffffffffff80._M_node,in_stack_ffffffffffffff88);
      }
    }
    shared_ptr<boost::detail::thread_data_base>::operator->
              ((shared_ptr<boost::detail::thread_data_base> *)in_stack_ffffffffffffff80._M_node);
    shared_ptr<boost::detail::thread_data_base>::reset(in_stack_ffffffffffffff90);
  }
  shared_ptr<boost::detail::thread_data_base>::~shared_ptr
            ((shared_ptr<boost::detail::thread_data_base> *)0x2a4e0f);
  return;
}

Assistant:

static void tls_destructor(void* data)
                {
                    //boost::detail::thread_data_base* thread_info=static_cast<boost::detail::thread_data_base*>(data);
                    boost::detail::thread_data_ptr thread_info = static_cast<boost::detail::thread_data_base*>(data)->shared_from_this();

                    if(thread_info)
                    {
                        while(!thread_info->tss_data.empty() || thread_info->thread_exit_callbacks)
                        {

                            while(thread_info->thread_exit_callbacks)
                            {
                                detail::thread_exit_callback_node* const current_node=thread_info->thread_exit_callbacks;
                                thread_info->thread_exit_callbacks=current_node->next;
                                if(current_node->func)
                                {
                                    (*current_node->func)();
                                    delete current_node->func;
                                }
                                delete current_node;
                            }
                            while (!thread_info->tss_data.empty())
                            {
                                std::map<void const*,detail::tss_data_node>::iterator current
                                    = thread_info->tss_data.begin();
                                if(current->second.func && (current->second.value!=0))
                                {
                                    (*current->second.func)(current->second.value);
                                }
                                thread_info->tss_data.erase(current);
                            }
                        }
                        thread_info->self.reset();
                    }
                }